

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall QGraphicsProxyWidget::paint(QGraphicsProxyWidget *this)

{
  QWidget *in_RCX;
  QStyleOptionGraphicsItem *in_RDX;
  QPainter *in_RSI;
  
  paint(this + -0x10,in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void QGraphicsProxyWidget::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_D(QGraphicsProxyWidget);
    Q_UNUSED(widget);
    if (!d->widget || !d->widget->isVisible())
        return;

    // Filter out repaints on the window frame.
    const QRect exposedWidgetRect = (option->exposedRect & rect()).toAlignedRect();
    if (exposedWidgetRect.isEmpty())
        return;

    // When rendering to pdf etc. painting may go outside widget boundaries unless clipped
    if (painter->device()->devType() != QInternal::Widget && (flags() & ItemClipsChildrenToShape))
        painter->setClipRect(d->widget->geometry(), Qt::IntersectClip);

    d->widget->render(painter, exposedWidgetRect.topLeft(), exposedWidgetRect);
}